

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFurnitureType::~IfcFurnitureType(IfcFurnitureType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x8b45d8;
  *(undefined8 *)&this->field_0x30 = 0x8b46f0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8b4600;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8b4628;
  *(undefined8 *)&this[-1].field_0x138 = 0x8b4650;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8b4678;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8b46a0;
  *(undefined8 *)this = 0x8b46c8;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x8b49b8;
  *(undefined8 *)&this->field_0x30 = 0x8b4a80;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8b49e0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8b4a08;
  *(undefined8 *)&this[-1].field_0x138 = 0x8b4a30;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8b4a58;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__008b4718);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcFurnitureType() : Object("IfcFurnitureType") {}